

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::OP_HasOwnPropScoped
               (Var scope,PropertyId propertyId,Var defaultInstance,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  JavascriptLibrary *this;
  RecyclableObject *pRVar4;
  undefined4 *puVar5;
  JavascriptArray *pJVar6;
  undefined4 extraout_var;
  Var instance;
  JavascriptArray *arrScope;
  ScriptContext *scriptContext_local;
  Var defaultInstance_local;
  PropertyId propertyId_local;
  Var scope_local;
  
  this = ScriptContext::GetLibrary(scriptContext);
  pRVar4 = JavascriptLibraryBase::GetNull(&this->super_JavascriptLibraryBase);
  if ((RecyclableObject *)scope != pRVar4) {
    bVar2 = Js::JavascriptArray::IsNonES5Array(scope);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x712,
                                  "(scope == scriptContext->GetLibrary()->GetNull() || JavascriptArray::IsNonES5Array(scope))"
                                  ,"Invalid scope chain pointer passed - should be null or an array"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  pJVar6 = Js::JavascriptArray::TryVarToNonES5Array(scope);
  if (pJVar6 == (JavascriptArray *)0x0) {
    scope_local._4_4_ =
         OP_HasOwnProperty(defaultInstance,propertyId,scriptContext,(PropertyString *)0x0);
  }
  else {
    iVar3 = (*(pJVar6->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])(pJVar6,0);
    scope_local._4_4_ =
         OP_HasOwnProperty((Var)CONCAT44(extraout_var,iVar3),propertyId,scriptContext,
                           (PropertyString *)0x0);
  }
  return scope_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::OP_HasOwnPropScoped(Var scope, PropertyId propertyId, Var defaultInstance, ScriptContext* scriptContext)
    {
        AssertMsg(scope == scriptContext->GetLibrary()->GetNull() || JavascriptArray::IsNonES5Array(scope),
                  "Invalid scope chain pointer passed - should be null or an array");

        JavascriptArray* arrScope = JavascriptArray::TryVarToNonES5Array(scope);
        if (arrScope)
        {
            Var instance = arrScope->DirectGetItem(0);
            return JavascriptOperators::OP_HasOwnProperty(instance, propertyId, scriptContext);
        }
        return JavascriptOperators::OP_HasOwnProperty(defaultInstance, propertyId, scriptContext);
    }